

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::ThreadContextTTD::NotifyCtxDestroyInRecord(ThreadContextTTD *this,ScriptContext *ctx)

{
  bool bVar1;
  ScriptContext *local_18;
  ScriptContext *ctx_local;
  
  local_18 = ctx;
  bVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
          Contains(&(this->m_contextList).
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   &local_18);
  if (bVar1) {
    JsUtil::
    List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Remove(&this->m_contextList,&local_18);
  }
  return;
}

Assistant:

void ThreadContextTTD::NotifyCtxDestroyInRecord(Js::ScriptContext* ctx)
    {
        if(this->m_contextList.Contains(ctx))
        {
            this->m_contextList.Remove(ctx);
        }
    }